

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_ecdsa_recovery_end_to_end(void)

{
  int iVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  bool bVar4;
  secp256k1_scalar key;
  secp256k1_scalar msg;
  int recid;
  secp256k1_pubkey recpubkey;
  secp256k1_pubkey pubkey;
  uchar sig [74];
  secp256k1_ecdsa_recoverable_signature rsignature [5];
  secp256k1_ecdsa_signature signature [5];
  uchar message [32];
  uchar privkey [32];
  uchar extra [32];
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  undefined4 in_stack_fffffffffffffbf0;
  uint32_t in_stack_fffffffffffffbf4;
  secp256k1_scalar *in_stack_fffffffffffffc10;
  secp256k1_context *in_stack_fffffffffffffc18;
  secp256k1_ecdsa_recoverable_signature *in_stack_fffffffffffffc20;
  secp256k1_ecdsa_recoverable_signature *in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc30;
  int recid_00;
  secp256k1_context *in_stack_fffffffffffffc38;
  secp256k1_ecdsa_recoverable_signature *in_stack_fffffffffffffc40;
  secp256k1_context *in_stack_fffffffffffffc48;
  uchar *in_stack_fffffffffffffc50;
  uchar *in_stack_fffffffffffffc58;
  secp256k1_ecdsa_recoverable_signature *in_stack_fffffffffffffc60;
  secp256k1_context *in_stack_fffffffffffffc68;
  secp256k1_pubkey *in_stack_fffffffffffffc70;
  secp256k1_context *in_stack_fffffffffffffc78;
  secp256k1_pubkey *in_stack_fffffffffffffca0;
  secp256k1_ecdsa_recoverable_signature *in_stack_fffffffffffffca8;
  secp256k1_pubkey *in_stack_fffffffffffffcb0;
  secp256k1_context *in_stack_fffffffffffffcb8;
  undefined1 auStack_1f4 [76];
  undefined1 local_1a8 [256];
  undefined1 auStack_a8 [128];
  undefined1 local_28 [31];
  undefined1 local_9;
  
  memset(local_28,0,0x20);
  recid_00 = 0;
  testutil_random_scalar_order_test(in_stack_fffffffffffffc10);
  testutil_random_scalar_order_test(in_stack_fffffffffffffc10);
  secp256k1_scalar_get_b32
            ((uchar *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
             (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  secp256k1_scalar_get_b32
            ((uchar *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
             (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  iVar1 = secp256k1_ec_seckey_verify(in_stack_fffffffffffffc18,(uchar *)in_stack_fffffffffffffc10);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x74,"test condition failed: secp256k1_ec_seckey_verify(CTX, privkey) == 1");
    abort();
  }
  iVar1 = secp256k1_ec_pubkey_create
                    (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                     (uchar *)in_stack_fffffffffffffc68);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x75,"test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, privkey) == 1");
    abort();
  }
  local_28[0] = 0;
  iVar1 = secp256k1_ecdsa_sign_recoverable
                    (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                     in_stack_fffffffffffffc50,(secp256k1_nonce_function)in_stack_fffffffffffffc48,
                     in_stack_fffffffffffffc40);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x79,
            "test condition failed: secp256k1_ecdsa_sign_recoverable(CTX, &rsignature[0], message, privkey, NULL, NULL) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_ecdsa_sign
                    (in_stack_fffffffffffffc68,
                     (secp256k1_ecdsa_signature *)in_stack_fffffffffffffc60,
                     in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                     (secp256k1_nonce_function)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x7a,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &signature[0], message, privkey, NULL, NULL) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_ecdsa_sign_recoverable
                    (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                     in_stack_fffffffffffffc50,(secp256k1_nonce_function)in_stack_fffffffffffffc48,
                     in_stack_fffffffffffffc40);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x7b,
            "test condition failed: secp256k1_ecdsa_sign_recoverable(CTX, &rsignature[4], message, privkey, NULL, NULL) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_ecdsa_sign_recoverable
                    (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                     in_stack_fffffffffffffc50,(secp256k1_nonce_function)in_stack_fffffffffffffc48,
                     in_stack_fffffffffffffc40);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x7c,
            "test condition failed: secp256k1_ecdsa_sign_recoverable(CTX, &rsignature[1], message, privkey, NULL, extra) == 1"
           );
    abort();
  }
  local_9 = 1;
  iVar1 = secp256k1_ecdsa_sign_recoverable
                    (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                     in_stack_fffffffffffffc50,(secp256k1_nonce_function)in_stack_fffffffffffffc48,
                     in_stack_fffffffffffffc40);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x7e,
            "test condition failed: secp256k1_ecdsa_sign_recoverable(CTX, &rsignature[2], message, privkey, NULL, extra) == 1"
           );
    abort();
  }
  local_9 = 0;
  local_28[0] = 1;
  iVar1 = secp256k1_ecdsa_sign_recoverable
                    (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                     in_stack_fffffffffffffc50,(secp256k1_nonce_function)in_stack_fffffffffffffc48,
                     in_stack_fffffffffffffc40);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x81,
            "test condition failed: secp256k1_ecdsa_sign_recoverable(CTX, &rsignature[3], message, privkey, NULL, extra) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_ecdsa_recoverable_signature_serialize_compact
                    (in_stack_fffffffffffffc38,(uchar *)CONCAT44(recid_00,in_stack_fffffffffffffc30)
                     ,(int *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x82,
            "test condition failed: secp256k1_ecdsa_recoverable_signature_serialize_compact(CTX, sig, &recid, &rsignature[4]) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_ecdsa_recoverable_signature_convert
                    (in_stack_fffffffffffffc38,
                     (secp256k1_ecdsa_signature *)CONCAT44(recid_00,in_stack_fffffffffffffc30),
                     in_stack_fffffffffffffc28);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x83,
            "test condition failed: secp256k1_ecdsa_recoverable_signature_convert(CTX, &signature[4], &rsignature[4]) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_memcmp_var(auStack_a8,local_1a8,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x84,
            "test condition failed: secp256k1_memcmp_var(&signature[4], &signature[0], 64) == 0");
    abort();
  }
  iVar1 = secp256k1_ecdsa_verify
                    (in_stack_fffffffffffffcb8,
                     (secp256k1_ecdsa_signature *)in_stack_fffffffffffffcb0,
                     in_stack_fffffffffffffca8->data,in_stack_fffffffffffffca0);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x85,
            "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[4], message, &pubkey) == 1"
           );
    abort();
  }
  memset(auStack_1f4,0,0x41);
  iVar1 = secp256k1_ecdsa_recoverable_signature_parse_compact
                    (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                     (uchar *)in_stack_fffffffffffffc38,recid_00);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x87,
            "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsignature[4], sig, recid) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_ecdsa_recoverable_signature_convert
                    (in_stack_fffffffffffffc38,
                     (secp256k1_ecdsa_signature *)CONCAT44(recid_00,in_stack_fffffffffffffc30),
                     in_stack_fffffffffffffc28);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x88,
            "test condition failed: secp256k1_ecdsa_recoverable_signature_convert(CTX, &signature[4], &rsignature[4]) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_ecdsa_verify
                    (in_stack_fffffffffffffcb8,
                     (secp256k1_ecdsa_signature *)in_stack_fffffffffffffcb0,
                     in_stack_fffffffffffffca8->data,in_stack_fffffffffffffca0);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x89,
            "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[4], message, &pubkey) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_ecdsa_recoverable_signature_parse_compact
                    (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                     (uchar *)in_stack_fffffffffffffc38,recid_00);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x8b,
            "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsignature[4], sig, recid) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_ecdsa_recover
                    (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                     in_stack_fffffffffffffca0->data);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x8c,
            "test condition failed: secp256k1_ecdsa_recover(CTX, &recpubkey, &rsignature[4], message) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_memcmp_var(&stack0xfffffffffffffc78,&stack0xfffffffffffffc38,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x8d,
            "test condition failed: secp256k1_memcmp_var(&pubkey, &recpubkey, sizeof(pubkey)) == 0")
    ;
    abort();
  }
  iVar1 = secp256k1_ecdsa_recoverable_signature_serialize_compact
                    (in_stack_fffffffffffffc38,(uchar *)CONCAT44(recid_00,in_stack_fffffffffffffc30)
                     ,(int *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x8f,
            "test condition failed: secp256k1_ecdsa_recoverable_signature_serialize_compact(CTX, sig, &recid, &rsignature[4]) == 1"
           );
    abort();
  }
  uVar2 = testrand_int(in_stack_fffffffffffffbf4);
  iVar1 = uVar2 + 1;
  uVar3 = testrand_bits(iVar1);
  (&stack0xfffffffffffffcb8)[uVar3] = (&stack0xfffffffffffffcb8)[uVar3] + (char)iVar1;
  iVar1 = secp256k1_ecdsa_recoverable_signature_parse_compact
                    (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                     (uchar *)in_stack_fffffffffffffc38,recid_00);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x91,
            "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsignature[4], sig, recid) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_ecdsa_recoverable_signature_convert
                    (in_stack_fffffffffffffc38,
                     (secp256k1_ecdsa_signature *)CONCAT44(recid_00,in_stack_fffffffffffffc30),
                     in_stack_fffffffffffffc28);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x92,
            "test condition failed: secp256k1_ecdsa_recoverable_signature_convert(CTX, &signature[4], &rsignature[4]) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_ecdsa_verify
                    (in_stack_fffffffffffffcb8,
                     (secp256k1_ecdsa_signature *)in_stack_fffffffffffffcb0,
                     in_stack_fffffffffffffca8->data,in_stack_fffffffffffffca0);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x93,
            "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[4], message, &pubkey) == 0"
           );
    abort();
  }
  iVar1 = secp256k1_ecdsa_recover
                    (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                     in_stack_fffffffffffffca0->data);
  bVar4 = true;
  if (iVar1 != 0) {
    iVar1 = secp256k1_memcmp_var(&stack0xfffffffffffffc78,&stack0xfffffffffffffc38,0x40);
    bVar4 = iVar1 != 0;
  }
  if (!bVar4) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0x96,
            "test condition failed: secp256k1_ecdsa_recover(CTX, &recpubkey, &rsignature[4], message) == 0 || secp256k1_memcmp_var(&pubkey, &recpubkey, sizeof(pubkey)) != 0"
           );
    abort();
  }
  return;
}

Assistant:

static void test_ecdsa_recovery_end_to_end(void) {
    unsigned char extra[32] = {0x00};
    unsigned char privkey[32];
    unsigned char message[32];
    secp256k1_ecdsa_signature signature[5];
    secp256k1_ecdsa_recoverable_signature rsignature[5];
    unsigned char sig[74];
    secp256k1_pubkey pubkey;
    secp256k1_pubkey recpubkey;
    int recid = 0;

    /* Generate a random key and message. */
    {
        secp256k1_scalar msg, key;
        testutil_random_scalar_order_test(&msg);
        testutil_random_scalar_order_test(&key);
        secp256k1_scalar_get_b32(privkey, &key);
        secp256k1_scalar_get_b32(message, &msg);
    }

    /* Construct and verify corresponding public key. */
    CHECK(secp256k1_ec_seckey_verify(CTX, privkey) == 1);
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, privkey) == 1);

    /* Serialize/parse compact and verify/recover. */
    extra[0] = 0;
    CHECK(secp256k1_ecdsa_sign_recoverable(CTX, &rsignature[0], message, privkey, NULL, NULL) == 1);
    CHECK(secp256k1_ecdsa_sign(CTX, &signature[0], message, privkey, NULL, NULL) == 1);
    CHECK(secp256k1_ecdsa_sign_recoverable(CTX, &rsignature[4], message, privkey, NULL, NULL) == 1);
    CHECK(secp256k1_ecdsa_sign_recoverable(CTX, &rsignature[1], message, privkey, NULL, extra) == 1);
    extra[31] = 1;
    CHECK(secp256k1_ecdsa_sign_recoverable(CTX, &rsignature[2], message, privkey, NULL, extra) == 1);
    extra[31] = 0;
    extra[0] = 1;
    CHECK(secp256k1_ecdsa_sign_recoverable(CTX, &rsignature[3], message, privkey, NULL, extra) == 1);
    CHECK(secp256k1_ecdsa_recoverable_signature_serialize_compact(CTX, sig, &recid, &rsignature[4]) == 1);
    CHECK(secp256k1_ecdsa_recoverable_signature_convert(CTX, &signature[4], &rsignature[4]) == 1);
    CHECK(secp256k1_memcmp_var(&signature[4], &signature[0], 64) == 0);
    CHECK(secp256k1_ecdsa_verify(CTX, &signature[4], message, &pubkey) == 1);
    memset(&rsignature[4], 0, sizeof(rsignature[4]));
    CHECK(secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsignature[4], sig, recid) == 1);
    CHECK(secp256k1_ecdsa_recoverable_signature_convert(CTX, &signature[4], &rsignature[4]) == 1);
    CHECK(secp256k1_ecdsa_verify(CTX, &signature[4], message, &pubkey) == 1);
    /* Parse compact (with recovery id) and recover. */
    CHECK(secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsignature[4], sig, recid) == 1);
    CHECK(secp256k1_ecdsa_recover(CTX, &recpubkey, &rsignature[4], message) == 1);
    CHECK(secp256k1_memcmp_var(&pubkey, &recpubkey, sizeof(pubkey)) == 0);
    /* Serialize/destroy/parse signature and verify again. */
    CHECK(secp256k1_ecdsa_recoverable_signature_serialize_compact(CTX, sig, &recid, &rsignature[4]) == 1);
    sig[testrand_bits(6)] += 1 + testrand_int(255);
    CHECK(secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsignature[4], sig, recid) == 1);
    CHECK(secp256k1_ecdsa_recoverable_signature_convert(CTX, &signature[4], &rsignature[4]) == 1);
    CHECK(secp256k1_ecdsa_verify(CTX, &signature[4], message, &pubkey) == 0);
    /* Recover again */
    CHECK(secp256k1_ecdsa_recover(CTX, &recpubkey, &rsignature[4], message) == 0 ||
          secp256k1_memcmp_var(&pubkey, &recpubkey, sizeof(pubkey)) != 0);
}